

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,xmlParserNodeInfoPtr info)

{
  int iVar1;
  unsigned_long uVar2;
  xmlParserNodeInfo *pxVar3;
  ulong local_38;
  unsigned_long i;
  int newSize;
  xmlParserNodeInfo *tmp;
  unsigned_long pos;
  xmlParserNodeInfoPtr info_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (info != (xmlParserNodeInfoPtr)0x0)) {
    uVar2 = xmlParserFindNodeInfoIndex(&ctxt->node_seq,info->node);
    if ((uVar2 < (ctxt->node_seq).length) &&
       (((ctxt->node_seq).buffer != (xmlParserNodeInfo *)0x0 &&
        ((ctxt->node_seq).buffer[uVar2].node == info->node)))) {
      memcpy((ctxt->node_seq).buffer + uVar2,info,0x28);
    }
    else {
      if ((ctxt->node_seq).maximum < (ctxt->node_seq).length + 1) {
        iVar1 = xmlGrowCapacity((int)(ctxt->node_seq).maximum,0x28,4,1000000000);
        if (iVar1 < 0) {
          xmlCtxtErrMemory(ctxt);
          return;
        }
        pxVar3 = (xmlParserNodeInfo *)(*xmlRealloc)((ctxt->node_seq).buffer,(long)iVar1 * 0x28);
        if (pxVar3 == (xmlParserNodeInfo *)0x0) {
          xmlCtxtErrMemory(ctxt);
          return;
        }
        (ctxt->node_seq).buffer = pxVar3;
        (ctxt->node_seq).maximum = (long)iVar1;
      }
      if (uVar2 != (ctxt->node_seq).length) {
        for (local_38 = (ctxt->node_seq).length; uVar2 < local_38; local_38 = local_38 - 1) {
          memcpy((ctxt->node_seq).buffer + local_38,(ctxt->node_seq).buffer + (local_38 - 1),0x28);
        }
      }
      memcpy((ctxt->node_seq).buffer + uVar2,info,0x28);
      (ctxt->node_seq).length = (ctxt->node_seq).length + 1;
    }
  }
  return;
}

Assistant:

void
xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,
                     xmlParserNodeInfoPtr info)
{
    unsigned long pos;

    if ((ctxt == NULL) || (info == NULL)) return;

    /* Find pos and check to see if node is already in the sequence */
    pos = xmlParserFindNodeInfoIndex(&ctxt->node_seq, (xmlNodePtr)
                                     info->node);

    if ((pos < ctxt->node_seq.length) &&
        (ctxt->node_seq.buffer != NULL) &&
        (ctxt->node_seq.buffer[pos].node == info->node)) {
        ctxt->node_seq.buffer[pos] = *info;
    }

    /* Otherwise, we need to add new node to buffer */
    else {
        if (ctxt->node_seq.length + 1 > ctxt->node_seq.maximum) {
            xmlParserNodeInfo *tmp;
            int newSize;

            newSize = xmlGrowCapacity(ctxt->node_seq.maximum, sizeof(tmp[0]),
                                      4, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            tmp = xmlRealloc(ctxt->node_seq.buffer, newSize * sizeof(tmp[0]));
            if (tmp == NULL) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            ctxt->node_seq.buffer = tmp;
            ctxt->node_seq.maximum = newSize;
        }

        /* If position is not at end, move elements out of the way */
        if (pos != ctxt->node_seq.length) {
            unsigned long i;

            for (i = ctxt->node_seq.length; i > pos; i--)
                ctxt->node_seq.buffer[i] = ctxt->node_seq.buffer[i - 1];
        }

        /* Copy element and increase length */
        ctxt->node_seq.buffer[pos] = *info;
        ctxt->node_seq.length++;
    }
}